

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateEnterInitializingModeIterativeAsync(HelicsFederate fed,HelicsError *err)

{
  Federate *pFVar1;
  HelicsFederate in_RSI;
  Federate *fedObj;
  Federate *in_stack_00000040;
  HelicsError *in_stack_ffffffffffffffe8;
  
  pFVar1 = getFed(in_RSI,in_stack_ffffffffffffffe8);
  if (pFVar1 != (Federate *)0x0) {
    helics::Federate::enterInitializingModeIterativeAsync(in_stack_00000040);
  }
  return;
}

Assistant:

void helicsFederateEnterInitializingModeIterativeAsync(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterInitializingModeIterativeAsync();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}